

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationtailoring.cpp
# Opt level: O1

void __thiscall icu_63::CollationTailoring::~CollationTailoring(CollationTailoring *this)

{
  UnicodeSet *this_00;
  void *in_RSI;
  
  (this->super_SharedObject).super_UObject._vptr_UObject =
       (_func_int **)&PTR__CollationTailoring_003e86e0;
  if (this->settings != (CollationSettings *)0x0) {
    SharedObject::removeRef(&this->settings->super_SharedObject);
    this->settings = (CollationSettings *)0x0;
  }
  if (this->ownedData != (CollationData *)0x0) {
    UMemory::operator_delete((UMemory *)this->ownedData,in_RSI);
  }
  if (this->builder != (UObject *)0x0) {
    (*this->builder->_vptr_UObject[1])();
  }
  udata_close_63(this->memory);
  ures_close_63(this->bundle);
  utrie2_close_63(this->trie);
  this_00 = this->unsafeBackwardSet;
  if (this_00 != (UnicodeSet *)0x0) {
    UnicodeSet::~UnicodeSet(this_00);
    UMemory::operator_delete((UMemory *)this_00,in_RSI);
  }
  uhash_close_63(this->maxExpansions);
  LOCK();
  (this->maxExpansionsInitOnce).fState.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  Locale::~Locale(&this->actualLocale);
  UnicodeString::~UnicodeString(&this->rules);
  SharedObject::~SharedObject(&this->super_SharedObject);
  return;
}

Assistant:

CollationTailoring::~CollationTailoring() {
    SharedObject::clearPtr(settings);
    delete ownedData;
    delete builder;
    udata_close(memory);
    ures_close(bundle);
    utrie2_close(trie);
    delete unsafeBackwardSet;
    uhash_close(maxExpansions);
    maxExpansionsInitOnce.reset();
}